

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_16a02::InstrumentMemoryAccesses::runOnFunction
          (InstrumentMemoryAccesses *this,Function *F)

{
  Module *pMVar1;
  Function *pFVar2;
  DataLayout *pDVar3;
  LLVMContext *C;
  StringRef SVar4;
  StringRef SVar5;
  ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_> local_d0;
  undefined1 local_c0 [8];
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> TheBuilder;
  StringRef local_28;
  Function *local_18;
  Function *F_local;
  InstrumentMemoryAccesses *this_local;
  
  local_18 = F;
  F_local = (Function *)this;
  pMVar1 = llvm::GlobalValue::getParent((GlobalValue *)F);
  llvm::StringRef::StringRef(&local_28,"__loadcheck");
  SVar4.Length = (size_t)local_28.Data;
  SVar4.Data = (char *)pMVar1;
  pFVar2 = (Function *)llvm::Module::getFunction(SVar4);
  this->LoadCheckFunction = pFVar2;
  if (this->LoadCheckFunction == (Function *)0x0) {
    __assert_fail("LoadCheckFunction && \"__loadcheck function has disappeared!\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                  ,0x55,
                  "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
                 );
  }
  pMVar1 = llvm::GlobalValue::getParent((GlobalValue *)local_18);
  llvm::StringRef::StringRef((StringRef *)&TheBuilder.Inserter,"__storecheck");
  SVar5.Length = TheBuilder._128_8_;
  SVar5.Data = (char *)pMVar1;
  pFVar2 = (Function *)llvm::Module::getFunction(SVar5);
  this->StoreCheckFunction = pFVar2;
  if (this->StoreCheckFunction == (Function *)0x0) {
    __assert_fail("StoreCheckFunction && \"__storecheck function has disappeared!\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                  ,0x58,
                  "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
                 );
  }
  llvm::GlobalValue::getParent((GlobalValue *)local_18);
  pDVar3 = (DataLayout *)llvm::Module::getDataLayout();
  this->TD = pDVar3;
  C = (LLVMContext *)llvm::Function::getContext();
  llvm::ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>::ArrayRef(&local_d0,None);
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
            ((IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_c0,C,
             (MDNode *)0x0,local_d0);
  this->Builder = (IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_c0;
  llvm::InstVisitor<(anonymous_namespace)::InstrumentMemoryAccesses,_void>::visit
            ((InstVisitor<(anonymous_namespace)::InstrumentMemoryAccesses,_void> *)this,local_18);
  llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::~IRBuilder
            ((IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_c0);
  return true;
}

Assistant:

bool InstrumentMemoryAccesses::runOnFunction(Function &F) {
    // Check that the load and store check functions are declared.
    LoadCheckFunction = F.getParent()->getFunction("__loadcheck");
    assert(LoadCheckFunction && "__loadcheck function has disappeared!\n");

    StoreCheckFunction = F.getParent()->getFunction("__storecheck");
    assert(StoreCheckFunction && "__storecheck function has disappeared!\n");

    TD = &F.getParent()->getDataLayout();
    IRBuilder<> TheBuilder(F.getContext());
    Builder = &TheBuilder;

    // Visit all of the instructions in the function.
    visit(F);
    return true;
}